

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O2

uint bidfx_public_api::tools::HexEncoder::DecodeNibble(uchar c)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this;
  string local_1c0 [32];
  stringstream error_message;
  ostream local_190 [376];
  
  if ((byte)(c - 0x30) < 10) {
    iVar1 = -0x30;
  }
  else if ((byte)(c + 0x9f) < 6) {
    iVar1 = -0x57;
  }
  else {
    if (5 < (byte)(c + 0xbf)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&error_message);
      poVar2 = std::operator<<(local_190,"cannot decode non-hex character: ");
      poVar2 = std::operator<<(poVar2,c);
      std::endl<char,std::char_traits<char>>(poVar2);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this,local_1c0);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar1 = -0x37;
  }
  return (uint)c + iVar1;
}

Assistant:

unsigned int HexEncoder::DecodeNibble(unsigned char c)
{
    if (c >= '0' && c <= '9') return c - '0';
    if (c >= 'a' && c <= 'f') return c - 'a' + 10u;
    if (c >= 'A' && c <= 'F') return c - 'A' + 10u;

    std::stringstream error_message;
    error_message << "cannot decode non-hex character: " << c << std::endl;
    throw std::invalid_argument(error_message.str());
}